

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O1

void __thiscall udpdiscovery::Peer::Stop(Peer *this,bool wait_for_threads)

{
  long lVar1;
  MinimalisticThreadInterface *pMVar2;
  
  if (this->env_ != (PeerEnvInterface *)0x0) {
    (*this->env_->_vptr_PeerEnvInterface[4])();
    this->env_ = (PeerEnvInterface *)0x0;
    pMVar2 = this->sending_thread_;
    if (wait_for_threads) {
      if (pMVar2 != (MinimalisticThreadInterface *)0x0) {
        (*pMVar2->_vptr_MinimalisticThreadInterface[3])();
      }
      pMVar2 = this->receiving_thread_;
      lVar1 = 0x18;
    }
    else {
      if (pMVar2 != (MinimalisticThreadInterface *)0x0) {
        (*pMVar2->_vptr_MinimalisticThreadInterface[2])();
      }
      pMVar2 = this->receiving_thread_;
      lVar1 = 0x10;
    }
    if (pMVar2 != (MinimalisticThreadInterface *)0x0) {
      (**(code **)((long)pMVar2->_vptr_MinimalisticThreadInterface + lVar1))();
    }
    if (this->sending_thread_ != (MinimalisticThreadInterface *)0x0) {
      (*this->sending_thread_->_vptr_MinimalisticThreadInterface[1])();
    }
    this->sending_thread_ = (MinimalisticThreadInterface *)0x0;
    if (this->receiving_thread_ != (MinimalisticThreadInterface *)0x0) {
      (*this->receiving_thread_->_vptr_MinimalisticThreadInterface[1])();
    }
    this->receiving_thread_ = (MinimalisticThreadInterface *)0x0;
  }
  return;
}

Assistant:

void Peer::Stop(bool wait_for_threads) {
  if (!env_) {
    return;
  }

  env_->Exit();

  // Threads live longer than the object itself. So env will be deleted in one
  // of the threads.
  env_ = 0;

  if (wait_for_threads) {
    if (sending_thread_) {
      sending_thread_->Join();
    }

    if (receiving_thread_) {
      receiving_thread_->Join();
    }
  } else {
    if (sending_thread_) {
      sending_thread_->Detach();
    }

    if (receiving_thread_) {
      receiving_thread_->Detach();
    }
  }

  delete sending_thread_;
  sending_thread_ = 0;
  delete receiving_thread_;
  receiving_thread_ = 0;
}